

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void NodeEnumSingletonsEx(anynode *Any,array *List,nodemodule *Module)

{
  long lVar1;
  long *plVar2;
  long *Ptr;
  
  if (Any != (anynode *)0x0) {
    lVar1 = **(long **)((long)Any + 8);
    List->_Begin = (char *)0x0;
    List->_Used = 0;
    plVar2 = *(long **)(lVar1 + 0x60);
    for (Ptr = plVar2;
        Ptr != (long *)((*(ulong *)(lVar1 + 0x68) & 0xfffffffffffffff8) + (long)plVar2);
        Ptr = Ptr + 1) {
      if ((*Ptr != 0) &&
         ((Module == (nodemodule *)0x0 || (*(nodemodule **)(*(long *)(*Ptr + 8) + -0x38) == Module))
         )) {
        ArrayAppend(List,Ptr,8,0x40);
        plVar2 = *(long **)(lVar1 + 0x60);
      }
    }
    return;
  }
  __assert_fail("(const void*)(Any)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x603,"void NodeEnumSingletonsEx(anynode *, array *, nodemodule *)");
}

Assistant:

static NOINLINE void NodeEnumSingletonsEx(anynode* Any,array* List, nodemodule* Module)
{
    nodecontext* p = Node_Context(Any);
    node** i;
    ArrayInit(List);

    for (i=ARRAYBEGIN(p->NodeSingleton,node*);i!=ARRAYEND(p->NodeSingleton,node*);++i)
        if (*i && (!Module || NodeGetClass(*i)->Module == Module))
            ArrayAppend(List,i,sizeof(*i),64);
}